

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

int dill_getreg(dill_stream_conflict s,int typ)

{
  int iVar1;
  void *pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar2 = dill_realloc((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
                       );
  *(void **)(*(long *)(in_RDI + 8) + 0x1d0) = pvVar2;
  *(undefined4 *)
   (*(long *)(*(long *)(in_RDI + 8) + 0x1d0) + (long)*(int *)(*(long *)(in_RDI + 8) + 0x1c8) * 0x2c)
       = in_ESI;
  *(undefined2 *)
   (*(long *)(*(long *)(in_RDI + 8) + 0x1d0) + (long)*(int *)(*(long *)(in_RDI + 8) + 0x1c8) * 0x2c
   + 0x10) = 0;
  *(undefined2 *)
   (*(long *)(*(long *)(in_RDI + 8) + 0x1d0) + (long)*(int *)(*(long *)(in_RDI + 8) + 0x1c8) * 0x2c
   + 0x12) = 0;
  *(undefined4 *)
   (*(long *)(*(long *)(in_RDI + 8) + 0x1d0) + (long)*(int *)(*(long *)(in_RDI + 8) + 0x1c8) * 0x2c
   + 8) = 0xdeadbeef;
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x1c8);
  *(int *)(*(long *)(in_RDI + 8) + 0x1c8) = iVar1 + 1;
  return iVar1 + 100;
}

Assistant:

extern int
dill_getreg(dill_stream s, int typ)
{
    s->p->vregs =
        realloc(s->p->vregs, (s->p->vreg_count + 1) * sizeof(vreg_info));
    s->p->vregs[s->p->vreg_count].typ = typ;
    s->p->vregs[s->p->vreg_count].use_info.use_count = 0;
    s->p->vregs[s->p->vreg_count].use_info.def_count = 0;
    s->p->vregs[s->p->vreg_count].offset = 0xdeadbeef;
    return ((s->p->vreg_count++) + 100);
}